

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

QTemporaryFile * QTemporaryFile::createNativeFile(QFile *file)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  QFilePrivate *pQVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *__buf;
  size_t __nbytes;
  int __oflag;
  char *__file;
  QIODevice *in_RDI;
  long in_FS_OFFSET;
  qint64 len;
  QTemporaryFile *ret;
  qint64 old_off;
  bool wasOpen;
  QAbstractFileEngine *engine;
  char buffer [1024];
  OpenModeFlag in_stack_fffffffffffffb6c;
  QIODevice *in_stack_fffffffffffffb70;
  QTemporaryFile *local_448;
  undefined8 local_440;
  QTemporaryFile *local_420;
  uint local_418;
  undefined4 local_414;
  QFlagsStorageHelper<QAbstractFileEngine::FileFlag,_4> local_40c;
  undefined1 local_408 [1024];
  long local_8;
  long *plVar5;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QFile::d_func((QFile *)0x2f9ccb);
  iVar2 = (*(pQVar4->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
            super_QObjectData._vptr_QObjectData[7])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar5 == (long *)0x0) {
    local_420 = (QTemporaryFile *)0x0;
  }
  else {
    QFlags<QAbstractFileEngine::FileFlag>::QFlags
              ((QFlags<QAbstractFileEngine::FileFlag> *)in_stack_fffffffffffffb70,
               in_stack_fffffffffffffb6c);
    (**(code **)(*plVar5 + 0xb0))(plVar5,local_414);
    __file = (char *)0x200000;
    local_40c.super_QFlagsStorage<QAbstractFileEngine::FileFlag>.i =
         (QFlagsStorage<QAbstractFileEngine::FileFlag>)
         QFlags<QAbstractFileEngine::FileFlag>::operator&
                   ((QFlags<QAbstractFileEngine::FileFlag> *)in_stack_fffffffffffffb70,
                    in_stack_fffffffffffffb6c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_40c);
    if (bVar1) {
      local_420 = (QTemporaryFile *)0x0;
    }
    else {
      bVar1 = QIODevice::isOpen(in_stack_fffffffffffffb70);
      local_440 = 0;
      if (bVar1) {
        iVar2 = (*(in_RDI->super_QObject)._vptr_QObject[0xf])();
        local_440 = CONCAT44(extraout_var_00,iVar2);
      }
      else {
        QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffb70,
                   in_stack_fffffffffffffb6c);
        __file = (char *)(ulong)local_418;
        uVar3 = (*(in_RDI->super_QObject)._vptr_QObject[0xd])();
        if ((uVar3 & 1) == 0) {
          local_420 = (QTemporaryFile *)0x0;
          goto LAB_002f9f06;
        }
      }
      local_448 = (QTemporaryFile *)operator_new(0x10);
      QTemporaryFile((QTemporaryFile *)0x2f9de5);
      uVar3 = open(local_448,__file,__oflag);
      if ((uVar3 & 1) == 0) {
        if (local_448 != (QTemporaryFile *)0x0) {
          (*(local_448->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject
            [4])();
        }
        local_448 = (QTemporaryFile *)0x0;
      }
      else {
        __nbytes = 0;
        (*(in_RDI->super_QObject)._vptr_QObject[0x11])(in_RDI,0);
        memset(local_408,0xaa,0x400);
        while (__buf = (void *)QIODevice::read(in_RDI,(int)local_408,(void *)0x400,__nbytes),
              0 < (long)__buf) {
          QIODevice::write((QIODevice *)local_448,(int)local_408,__buf,__nbytes);
        }
        (*(local_448->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject
          [0x11])(local_448,0);
      }
      if (bVar1) {
        (*(in_RDI->super_QObject)._vptr_QObject[0x11])(in_RDI,local_440);
      }
      else {
        (*(in_RDI->super_QObject)._vptr_QObject[0xe])();
      }
      local_420 = local_448;
    }
  }
LAB_002f9f06:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_420;
}

Assistant:

QTemporaryFile *QTemporaryFile::createNativeFile(QFile &file)
{
    if (QAbstractFileEngine *engine = file.d_func()->engine()) {
        if (engine->fileFlags(QAbstractFileEngine::FlagsMask) & QAbstractFileEngine::LocalDiskFlag)
            return nullptr; // native already
        //cache
        bool wasOpen = file.isOpen();
        qint64 old_off = 0;
        if (wasOpen)
            old_off = file.pos();
        else if (!file.open(QIODevice::ReadOnly))
            return nullptr;
        //dump data
        QTemporaryFile *ret = new QTemporaryFile;
        if (ret->open()) {
            file.seek(0);
            char buffer[1024];
            while (true) {
                qint64 len = file.read(buffer, 1024);
                if (len < 1)
                    break;
                ret->write(buffer, len);
            }
            ret->seek(0);
        } else {
            delete ret;
            ret = nullptr;
        }
        //restore
        if (wasOpen)
            file.seek(old_off);
        else
            file.close();
        //done
        return ret;
    }
    return nullptr;
}